

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void box3_subdivide(box3_t bbox,box3_t *out)

{
  box3_t bVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 in_stack_00000008;
  float local_88 [2];
  vec3_t ps [2];
  float afStack_68 [2];
  vec3_t vs [8];
  
  bVar1 = bbox;
  ps[0].x = bbox.min.x;
  ps[0].y = bbox.min.y;
  ps[0].z = bbox.min.z;
  ps[1].x = bbox.max.x;
  lVar2 = 8;
  do {
    fVar3 = ps[*(int *)((long)&cube_table[0].x + lVar2)].x;
    *(ulong *)((long)&ps[1].y + lVar2) =
         CONCAT44(ps[(long)*(int *)((long)&DAT_0010805c + lVar2) + -1].z,
                  local_88[(long)*(int *)((long)&DAT_00108058 + lVar2) * 3]);
    *(float *)((long)afStack_68 + lVar2) = fVar3;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x68);
  fVar3 = (bVar1.min.y + (float)in_stack_00000008) * 0.5;
  fVar5 = (bVar1.min.z + (float)((ulong)in_stack_00000008 >> 0x20)) * 0.5;
  fVar4 = (bbox.max.x + bbox.min.x) * 0.5;
  lVar2 = 0;
  do {
    fVar8 = *(float *)((long)&vs[0].x + lVar2);
    fVar6 = (float)*(undefined8 *)((long)afStack_68 + lVar2);
    fVar9 = fVar3;
    if (fVar6 <= fVar3) {
      fVar9 = fVar6;
    }
    fVar10 = fVar3;
    if (fVar3 <= fVar6) {
      fVar10 = fVar6;
    }
    fVar7 = (float)((ulong)*(undefined8 *)((long)afStack_68 + lVar2) >> 0x20);
    fVar6 = fVar5;
    if (fVar7 <= fVar5) {
      fVar6 = fVar7;
    }
    fVar11 = fVar4;
    if (fVar8 <= fVar4) {
      fVar11 = fVar8;
    }
    fVar12 = fVar5;
    if (fVar5 <= fVar7) {
      fVar12 = fVar7;
    }
    fVar7 = fVar4;
    if (fVar4 <= fVar8) {
      fVar7 = fVar8;
    }
    fVar8 = fVar9;
    if (fVar10 <= fVar9) {
      fVar8 = fVar10;
    }
    fVar13 = fVar6;
    if (fVar12 <= fVar6) {
      fVar13 = fVar12;
    }
    fVar14 = fVar11;
    if (fVar7 <= fVar11) {
      fVar14 = fVar7;
    }
    if (fVar9 <= fVar10) {
      fVar9 = fVar10;
    }
    if (fVar6 <= fVar12) {
      fVar6 = fVar12;
    }
    if (fVar11 <= fVar7) {
      fVar11 = fVar7;
    }
    *(ulong *)((long)&(out->min).x + lVar2 * 2) = CONCAT44(fVar13,fVar8);
    *(float *)((long)&(out->min).z + lVar2 * 2) = fVar14;
    *(ulong *)((long)&(out->max).x + lVar2 * 2) = CONCAT44(fVar6,fVar9);
    *(float *)((long)&(out->max).z + lVar2 * 2) = fVar11;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x60);
  return;
}

Assistant:

void
box3_subdivide(box3_t bbox, box3_t out[3]) {
    vec3_t  ps[2] = { bbox.min, bbox.max };

    vec3_t  vs[8];
    for( uint32_t i = 0; i < 8; ++i ) {
        vs[i] = vec3(ps[cube_table[i].x].x, ps[cube_table[i].y].y, ps[cube_table[i].z].z);
    }

    vec3_t  center = box3_center(bbox);

    for( uint32_t i = 0; i < 8; ++i ) {
        out[i] = box3(vec3_min(center, vs[i]), vec3_max(center, vs[i]));
    }
}